

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

void __thiscall hacd::vector<HACD::ChUll_*>::recreate(vector<HACD::ChUll_*> *this,HaU32 capacity)

{
  uint uVar1;
  ChUll **ppCVar2;
  ChUll **ppCVar3;
  long lVar4;
  
  ppCVar3 = allocate(this,capacity);
  ppCVar2 = this->mData;
  if ((capacity != 0) && ((ppCVar3 == (ChUll **)0x0 || (ppCVar3 == ppCVar2)))) {
    __assert_fail("!capacity || newData && newData != mData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                  ,0x23b,"void hacd::vector<HACD::ChUll *>::recreate(HaU32) [T = HACD::ChUll *]");
  }
  uVar1 = this->mSize;
  for (lVar4 = 0; (ChUll **)((long)ppCVar3 + lVar4) < ppCVar3 + uVar1; lVar4 = lVar4 + 8) {
    *(ChUll **)((long)ppCVar3 + lVar4) = *(ChUll **)((long)ppCVar2 + lVar4);
  }
  if (-1 < (int)this->mCapacity) {
    free(this->mData);
  }
  this->mData = ppCVar3;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}